

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3SelectPrep(Parse *pParse,Select *p,NameContext *pOuterNC)

{
  long in_FS_OFFSET;
  undefined1 local_58 [40];
  anon_union_8_18_67db040d_for_u aStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pParse->db->mallocFailed == '\0') && ((p->selFlags & 0x80) == 0)) {
    local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    aStack_30.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = sqlite3ExprWalkNoop;
    local_58._0_8_ = pParse;
    if (pParse->hasCompound != '\0') {
      local_58._16_8_ = convertCompoundSelectToSubquery;
      local_58._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
      sqlite3WalkSelect((Walker *)local_58,p);
    }
    local_58._16_8_ = selectExpander;
    local_58._24_8_ = sqlite3SelectPopWith;
    local_58._36_2_ = 0;
    sqlite3WalkSelect((Walker *)local_58,p);
    if (pParse->nErr == 0) {
      local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = resolveExprStep;
      local_58._16_8_ = resolveSelectStep;
      local_58._24_8_ = (_func_void_Walker_ptr_Select_ptr *)0x0;
      local_58._0_8_ = pParse;
      aStack_30.pNC = pOuterNC;
      sqlite3WalkSelect((Walker *)local_58,p);
      if (pParse->nErr == 0) {
        local_58._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        aStack_30.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._16_8_ = sqlite3SelectWalkNoop;
        local_58._24_8_ = selectAddSubqueryTypeInfo;
        local_58._8_8_ = sqlite3ExprWalkNoop;
        local_58._0_8_ = pParse;
        sqlite3WalkSelect((Walker *)local_58,p);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3SelectPrep(
  Parse *pParse,         /* The parser context */
  Select *p,             /* The SELECT statement being coded. */
  NameContext *pOuterNC  /* Name context for container */
){
  assert( p!=0 || pParse->db->mallocFailed );
  assert( pParse->db->pParse==pParse );
  if( pParse->db->mallocFailed ) return;
  if( p->selFlags & SF_HasTypeInfo ) return;
  sqlite3SelectExpand(pParse, p);
  if( pParse->nErr ) return;
  sqlite3ResolveSelectNames(pParse, p, pOuterNC);
  if( pParse->nErr ) return;
  sqlite3SelectAddTypeInfo(pParse, p);
}